

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::toTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,RenderBits renderBits)

{
  bool bVar1;
  ostream *poVar2;
  bool *pbVar3;
  long lVar4;
  ostringstream stream;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  bVar1 = true;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x10) {
    if ((*(uint *)((long)&DAT_01e60ad0 + lVar4) & (uint)this) != 0) {
      pbVar3 = (bool *)0x189ed75;
      if (bVar1) {
        pbVar3 = glcts::fixed_sample_locations_values + 1;
      }
      poVar2 = std::operator<<((ostream *)local_1a8,pbVar3);
      std::operator<<(poVar2,*(char **)((long)&DAT_01e60ad8 + lVar4));
      bVar1 = false;
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string toTestName (RenderBits renderBits)
{
	struct
	{
		RenderBits	bit;
		const char*	str;
	} bitInfos[] =
	{
		{ RENDERBITS_AS_VERTEX_ARRAY,		"as_vertex_array"		},
		{ RENDERBITS_AS_INDEX_ARRAY,		"as_index_array"		},
		{ RENDERBITS_AS_VERTEX_TEXTURE,		"as_vertex_texture"		},
		{ RENDERBITS_AS_FRAGMENT_TEXTURE,	"as_fragment_texture"	}
	};

	std::ostringstream	stream;
	bool				first	= true;

	DE_ASSERT(renderBits != 0);

	for (int infoNdx = 0; infoNdx < DE_LENGTH_OF_ARRAY(bitInfos); infoNdx++)
	{
		if (renderBits & bitInfos[infoNdx].bit)
		{
			stream << (first ? "" : "_") << bitInfos[infoNdx].str;
			first = false;
		}
	}

	return stream.str();
}